

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O2

ValueCallback *
ValueCallback::findCallback
          (deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks,OIDType *oid,
          bool walk,size_t startAt,size_t *foundAt)

{
  ValueCallback *pVVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  reference ppVVar5;
  size_t i;
  
  bVar2 = false;
  while( true ) {
    sVar4 = std::deque<ValueCallback_*,_std::allocator<ValueCallback_*>_>::size(callbacks);
    if (sVar4 <= startAt) {
      return (ValueCallback *)0x0;
    }
    ppVVar5 = std::_Deque_iterator<ValueCallback_*,_ValueCallback_*&,_ValueCallback_**>::operator[]
                        (&(callbacks->
                          super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>).
                          _M_impl.super__Deque_impl_data._M_start,startAt);
    pVVar1 = *ppVVar5;
    if (bVar2 != false) break;
    bVar2 = std::operator==(&oid->data,&(pVVar1->OID->super_OIDType).data);
    if (bVar2) {
      if (!walk) break;
    }
    else if ((walk) && (bVar3 = OIDType::isSubTreeOf(&pVVar1->OID->super_OIDType,oid), bVar3))
    break;
    startAt = startAt + 1;
  }
  if (foundAt == (size_t *)0x0) {
    return pVVar1;
  }
  *foundAt = startAt;
  return pVVar1;
}

Assistant:

ValueCallback* ValueCallback::findCallback(std::deque<ValueCallback*> &callbacks, const OIDType* const oid, bool walk, size_t startAt, size_t *foundAt){
    bool useNext = false;

    for(size_t i = startAt; i < callbacks.size(); i++){
        auto callback = callbacks[i];

        if(useNext){
            if(foundAt){
                *foundAt = i;
            }
            return callback;
        }

        if(oid->equals(callback->OID)){
            if(walk){
                useNext = true;
                continue;
            }
            if(foundAt){
                *foundAt = i;
            }
            return callback;
        }

        if(walk && callback->OID->isSubTreeOf(oid)){
            // If the oid passed in is a substring of our current callback, and it begins at the start
            if(foundAt){
                *foundAt = i;
            }
            return callback;
        }
    }
    return nullptr;
}